

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

void ffrprt(FILE *stream,int status)

{
  int iVar1;
  uint in_ESI;
  FILE *in_RDI;
  char errmsg [81];
  char status_str [31];
  undefined1 auStack_98 [16];
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  undefined1 local_38 [44];
  uint local_c;
  FILE *local_8;
  
  if (in_ESI != 0) {
    local_c = in_ESI;
    local_8 = in_RDI;
    ffgerr(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
    fprintf(local_8,"\nFITSIO status = %d: %s\n",(ulong)local_c,local_38);
    while (iVar1 = ffgmsg((char *)0x1200bb), iVar1 != 0) {
      fprintf(local_8,"%s\n",auStack_98);
    }
  }
  return;
}

Assistant:

void ffrprt( FILE *stream, int status)
/* 
   Print out report of cfitsio error status and messages on the error stack.
   Uses C FILE stream.
*/
{
    char status_str[FLEN_STATUS], errmsg[FLEN_ERRMSG];
  
    if (status)
    {

      fits_get_errstatus(status, status_str);  /* get the error description */
      fprintf(stream, "\nFITSIO status = %d: %s\n", status, status_str);

      while ( fits_read_errmsg(errmsg) )  /* get error stack messages */
             fprintf(stream, "%s\n", errmsg);
    }
    return; 
}